

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

string * __thiscall
soul::AST::Connection::getEndpointName_abi_cxx11_
          (string *__return_storage_ptr__,Connection *this,Expression *e,bool isSource)

{
  bool bVar1;
  EndpointDeclaration *pEVar2;
  string *psVar3;
  ConnectionEndpointRef *pCVar4;
  UnqualifiedName *this_00;
  ArrayElementRef *pAVar5;
  Connection *this_01;
  DotOperator *pDVar6;
  ProcessorBase *errorContext;
  undefined1 isSource_00;
  undefined1 in_R8B;
  CompileMessage local_90;
  pool_ptr<soul::AST::ProcessorBase> local_58;
  pool_ptr<soul::AST::ProcessorBase> p;
  pool_ptr<soul::AST::DotOperator> dot;
  pool_ptr<soul::AST::ArrayElementRef> ar;
  pool_ptr<soul::AST::ConnectionEndpointRef> er;
  pool_ptr<soul::AST::EndpointDeclaration> local_28;
  pool_ptr<soul::AST::EndpointDeclaration> endpoint;
  bool isSource_local;
  Expression *e_local;
  
  endpoint.object._7_1_ = (byte)e & 1;
  psVar3 = __return_storage_ptr__;
  (*(this->super_ASTObject)._vptr_ASTObject[8])(&local_28);
  isSource_00 = SUB81(psVar3,0);
  bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_28);
  if (bVar1) {
    pEVar2 = pool_ptr<soul::AST::EndpointDeclaration>::operator->(&local_28);
    psVar3 = Identifier::operator_cast_to_string_(&pEVar2->name);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
  }
  pool_ptr<soul::AST::EndpointDeclaration>::~pool_ptr(&local_28);
  if (!bVar1) {
    cast<soul::AST::ConnectionEndpointRef,soul::AST::Expression>((soul *)&ar,(Expression *)this);
    bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&ar);
    if (bVar1) {
      pCVar4 = pool_ptr<soul::AST::ConnectionEndpointRef>::operator->
                         ((pool_ptr<soul::AST::ConnectionEndpointRef> *)&ar);
      this_00 = pool_ptr<soul::AST::UnqualifiedName>::operator->(&pCVar4->endpointName);
      UnqualifiedName::toString_abi_cxx11_(__return_storage_ptr__,this_00);
    }
    pool_ptr<soul::AST::ConnectionEndpointRef>::~pool_ptr
              ((pool_ptr<soul::AST::ConnectionEndpointRef> *)&ar);
    if (!bVar1) {
      cast<soul::AST::ArrayElementRef,soul::AST::Expression>((soul *)&dot,(Expression *)this);
      bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&dot);
      if (bVar1) {
        pAVar5 = pool_ptr<soul::AST::ArrayElementRef>::operator->
                           ((pool_ptr<soul::AST::ArrayElementRef> *)&dot);
        this_01 = (Connection *)pool_ptr<soul::AST::Expression>::operator*(&pAVar5->object);
        getEndpointName_abi_cxx11_
                  (__return_storage_ptr__,this_01,(Expression *)(ulong)(endpoint.object._7_1_ & 1),
                   (bool)isSource_00);
      }
      pool_ptr<soul::AST::ArrayElementRef>::~pool_ptr((pool_ptr<soul::AST::ArrayElementRef> *)&dot);
      if (!bVar1) {
        cast<soul::AST::DotOperator,soul::AST::Expression>((soul *)&p,(Expression *)this);
        bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&p);
        if (bVar1) {
          pDVar6 = pool_ptr<soul::AST::DotOperator>::operator->
                             ((pool_ptr<soul::AST::DotOperator> *)&p);
          UnqualifiedName::toString_abi_cxx11_(__return_storage_ptr__,pDVar6->rhs);
        }
        pool_ptr<soul::AST::DotOperator>::~pool_ptr((pool_ptr<soul::AST::DotOperator> *)&p);
        if (!bVar1) {
          (*(this->super_ASTObject)._vptr_ASTObject[6])(&local_58);
          bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_58);
          if (bVar1) {
            errorContext = pool_ptr<soul::AST::ProcessorBase>::operator*(&local_58);
            getDefaultEndpointName_abi_cxx11_
                      (__return_storage_ptr__,(Connection *)&(this->super_ASTObject).context,
                       (Context *)errorContext,
                       (ProcessorBase *)(ulong)((byte)~endpoint.object._7_1_ & 1),(bool)in_R8B);
          }
          pool_ptr<soul::AST::ProcessorBase>::~pool_ptr(&local_58);
          if (!bVar1) {
            Errors::expectedProcessorOrEndpoint<>();
            Context::throwError(&(this->super_ASTObject).context,&local_90,false);
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string getEndpointName (Expression& e, bool isSource)
        {
            if (auto endpoint = e.getAsEndpoint())           return endpoint->name;
            if (auto er = cast<ConnectionEndpointRef> (e))   return er->endpointName->toString();
            if (auto ar = cast<ArrayElementRef> (e))         return getEndpointName (*ar->object, isSource);
            if (auto dot = cast<DotOperator> (e))            return dot->rhs.toString();
            if (auto p = e.getAsProcessor())                 return getDefaultEndpointName (e.context, *p, ! isSource);

            e.context.throwError (Errors::expectedProcessorOrEndpoint());
        }